

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

int Session_create(Session_t **handle)

{
  ShPtr<HG::SessionImpl> SVar1;
  ShPtrRep *in_RAX;
  ShPtr<HG::SessionImpl> local_18;
  
  local_18.cblock = in_RAX;
  make_myshared<HG::SessionImpl>();
  SVar1.cblock = local_18.cblock;
  local_18.cblock = (ShPtrRep *)0x0;
  *handle = (Session_t *)SVar1.cblock;
  ShPtr<HG::SessionImpl>::decref(&local_18);
  return 0;
}

Assistant:

int Session_create(Session_t **handle) {
    *handle = HgHandles::release(make_myshared<HG::SessionImpl>());
    return 0;
}